

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O3

bool __thiscall
Js::RangeUnitContains<Js::SourceFunctionNode>
          (Js *this,RangeUnit<Js::SourceFunctionNode> unit,SourceFunctionNode n)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar6 = (ulong)unit.j >> 0x20;
  if (uVar6 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.cpp"
                                ,0x7c,"(n.functionId != (uint32)-1)","n.functionId != (uint32)-1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar5 = unit.j.sourceContextId;
  uVar8 = (uint)this;
  uVar7 = unit.i.sourceContextId;
  if (uVar7 < uVar5 || uVar5 < uVar8) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (unit.i.functionId != 0xfffffffe || uVar5 != uVar7) {
      iVar4 = (int)((ulong)this >> 0x20);
      if (iVar4 != -2 || uVar5 != uVar8) {
        if ((unit.i.functionId == 0xffffffff && uVar5 == uVar7) || (iVar4 == -1 && uVar5 == uVar8))
        {
          bVar2 = uVar6 != 0;
        }
        else {
          bVar2 = (uVar6 <= (ulong)unit.i >> 0x20 || uVar5 != uVar7) &&
                  ((ulong)this >> 0x20 <= uVar6 || uVar5 != uVar8);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool RangeUnitContains<SourceFunctionNode>(RangeUnit<SourceFunctionNode> unit, SourceFunctionNode n)
    {
        Assert(n.functionId != (uint32)-1);

        if ((n.sourceContextId >= unit.i.sourceContextId) &&
            (n.sourceContextId <= unit.j.sourceContextId)
            )
        {
            if ((n.sourceContextId == unit.j.sourceContextId && -2 == unit.j.functionId) ||  //#.#-#.* case
                (n.sourceContextId == unit.i.sourceContextId && -2 == unit.i.functionId)     //#.*-#.# case
                )
            {
                return true;
            }

            if ((n.sourceContextId == unit.j.sourceContextId && -1 == unit.j.functionId) || //#.#-#.+ case
                (n.sourceContextId == unit.i.sourceContextId && -1 == unit.i.functionId)     //#.+-#.# case
                )
            {
                return n.functionId != 0;
            }

            if ((n.sourceContextId == unit.i.sourceContextId && n.functionId < unit.i.functionId) || //excludes all values less than functionId LHS
                (n.sourceContextId == unit.j.sourceContextId && n.functionId > unit.j.functionId)) ////excludes all values greater than functionId RHS
            {
                return false;
            }

            return true;
        }

        return false;
    }